

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Position::Position(Position *this,Position *position,Move *move)

{
  Board *this_00;
  pointer puVar1;
  pointer pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  Square source;
  stringstream ss;
  string local_1d8;
  Square local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  King *pKVar4;
  
  this_00 = &this->m_Board;
  BoardHashing::BoardHashing((BoardHashing *)this_00);
  (this->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase._vptr_BoardBase =
       (_func_int **)&PTR_Set_001206d0;
  (this->m_sEnPassant).i = 0;
  (this->m_sEnPassant).j = 0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PreviousPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyFrom(this,position);
  local_1b8 = move->m_Source;
  DevirginizeRooks(this,&local_1b8);
  iVar3 = (*(this->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.
            _vptr_BoardBase[1])(this_00,(ulong)(uint)(local_1b8.j * 8 + local_1b8.i));
  pKVar4 = (King *)CONCAT44(extraout_var,iVar3);
  if (pKVar4 == &WhiteKing) {
    this->m_bVirginWhiteKing = false;
  }
  if (pKVar4 == &BlackKing) {
    this->m_bVirginBlackKing = false;
  }
  if (move == &NullMove) {
    this->m_ColorToMove = (Color)(this->m_ColorToMove ^ 1);
  }
  else {
    if (pKVar4 == (King *)&None) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,"Illegal move: no piece found at source location for move ",0x39);
      Move::operator_cast_to_string(&local_1d8,move);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      Die(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(local_130);
      puVar1 = (this->m_PreviousPositions).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      pMVar2 = (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar2 != (pointer)0x0) {
        operator_delete(pMVar2);
      }
      pMVar2 = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar2 != (pointer)0x0) {
        operator_delete(pMVar2);
      }
      _Unwind_Resume(extraout_RAX);
    }
    if (move->m_PromoteTo == &None.super_Piece) {
      MovePiece(this,position,move);
    }
    else {
      PromotePiece(this,position,move);
    }
    (**(this_00->super_BoardPieceSquare).super_BoardHashing.super_BoardBase._vptr_BoardBase)
              (this_00,(ulong)(((uint)((ulong)move->m_Source >> 0x1d) & 0xfffffff8) +
                              (move->m_Source).i),&None);
    this->m_ColorToMove = (Color)(this->m_ColorToMove ^ 1);
    PushHashInHistory(this);
  }
  return;
}

Assistant:

Position( const Position &position, const Move &move )
    {
        CopyFrom( position );

        Square source = move.Source();
        DevirginizeRooks( source );

        const Piece *pPiece = GetBoard().Get( source );
        DevirginizeKing( pPiece );

        if ( &move == &NullMove )
        {
            SetColorToMove( !GetColorToMove() );
            return;
        }

        if ( pPiece == &None )
        {
            stringstream ss;
            ss << "Illegal move: no piece found at source location for move ";
            ss << ( string ) move;
            Die( ss.str() );
        }

        if ( move.GetPromoteTo() == &None )
            MovePiece( position, move );
        else
            PromotePiece( position, move );

        m_Board.Set( move.Source().I(), move.Source().J(), &None );
        SetColorToMove( !GetColorToMove() );

        PushHashInHistory();
    }